

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_mapper_posix.hpp
# Opt level: O3

void __thiscall tao::pegtl::internal::file_mapper::file_mapper(file_mapper *this,char *filename)

{
  int in_EDX;
  file_opener local_20;
  
  local_20.m_source = filename;
  local_20.m_fd = file_opener::open(&local_20,filename,in_EDX);
  file_mapper(this,&local_20);
  close(local_20.m_fd);
  return;
}

Assistant:

explicit file_mapper( const char* filename )
               : file_mapper( file_opener( filename ) )
            {
            }